

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

iterator * __thiscall boost::filesystem::path::end(path *this)

{
  iterator *itr;
  iterator *in_RDI;
  
  (in_RDI->m_element).m_pathname._M_dataplus._M_p = (pointer)&(in_RDI->m_element).m_pathname.field_2
  ;
  (in_RDI->m_element).m_pathname._M_string_length = 0;
  (in_RDI->m_element).m_pathname.field_2._M_local_buf[0] = '\0';
  in_RDI->m_path_ptr = this;
  in_RDI->m_pos = (this->m_pathname)._M_string_length;
  return in_RDI;
}

Assistant:

path::iterator path::end() const
  {
    iterator itr;
    itr.m_path_ptr = this;
    itr.m_pos = m_pathname.size();
    return itr;
  }